

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::Session::libIdentify(Session *this)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  
  lVar1 = std::cout;
  *(uint *)(pthread_kill + *(long *)(std::cout + -0x18)) =
       *(uint *)(pthread_kill + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 0x10;
  poVar3 = std::operator<<((ostream *)&std::cout,"description: ");
  poVar3 = std::operator<<(poVar3,"A Catch2 test executable\n");
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffff4f | 0x20;
  *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x10) = 0x10;
  poVar3 = std::operator<<(poVar3,"category: ");
  poVar3 = std::operator<<(poVar3,"testframework\n");
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffff4f | 0x20;
  *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x10) = 0x10;
  poVar3 = std::operator<<(poVar3,"framework: ");
  poVar3 = std::operator<<(poVar3,"Catch Test\n");
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffff4f | 0x20;
  *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x10) = 0x10;
  poVar3 = std::operator<<(poVar3,"version: ");
  libraryVersion();
  Catch::operator<<(poVar3,&libraryVersion::version);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

double standard_deviation(std::vector<double>::iterator first, std::vector<double>::iterator last) {
        auto m = Catch::Benchmark::Detail::mean(first, last);
        double variance = std::accumulate(first, last, 0., [m](double a, double b) {
            double diff = b - m;
            return a + diff * diff;
            }) / (last - first);
            return std::sqrt(variance);
    }